

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

long delegation(OperationConfig *config,char *str)

{
  int iVar1;
  long lVar2;
  
  iVar1 = curl_strequal("none");
  if (iVar1 == 0) {
    iVar1 = curl_strequal("policy",str);
    lVar2 = 1;
    if (iVar1 == 0) {
      iVar1 = curl_strequal("always",str);
      lVar2 = 2;
      if (iVar1 == 0) {
        lVar2 = 0;
        warnf(config->global,"unrecognized delegation method \'%s\', using none\n",str);
      }
    }
  }
  else {
    lVar2 = 0;
  }
  return lVar2;
}

Assistant:

long delegation(struct OperationConfig *config, char *str)
{
  if(curl_strequal("none", str))
    return CURLGSSAPI_DELEGATION_NONE;
  if(curl_strequal("policy", str))
    return CURLGSSAPI_DELEGATION_POLICY_FLAG;
  if(curl_strequal("always", str))
    return CURLGSSAPI_DELEGATION_FLAG;

  warnf(config->global, "unrecognized delegation method '%s', using none\n",
        str);

  return CURLGSSAPI_DELEGATION_NONE;
}